

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift_helper_template.h
# Opt level: O3

target_ulong helper_rcll_x86_64(CPUX86State *env,target_ulong t0,target_ulong t1)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = (uint)t1 & 0x1f;
  if ((t1 & 0x1f) != 0) {
    uVar2 = (uint)t0;
    uVar5 = t0 & 0xffffffff;
    uVar6 = (uint)env->cc_src;
    cVar1 = (char)uVar4;
    uVar3 = 0;
    if (uVar4 != 1) {
      uVar3 = uVar5 >> (0x21U - cVar1 & 0x3f);
    }
    t0 = uVar3 | uVar5 << ((byte)t1 & 0x1f) | (ulong)(uVar6 & 1) << (cVar1 - 1U & 0x3f);
    env->cc_src = (ulong)((uVar5 >> ((ulong)(byte)(0x20 - cVar1) & 0x3f) & 1) != 0) |
                  (long)(int)uVar6 & 0xfffffffffffff7feU |
                  (ulong)((uVar2 ^ (uint)t0) >> 0x14 & 0x800);
  }
  return t0;
}

Assistant:

target_ulong glue(helper_rcl, SUFFIX)(CPUX86State *env, target_ulong t0,
                                      target_ulong t1)
{
    int count, eflags;
    target_ulong src;
    target_long res;

    count = t1 & SHIFT1_MASK;
#if DATA_BITS == 16
    count = rclw_table[count];
#elif DATA_BITS == 8
    count = rclb_table[count];
#endif
    if (count) {
        eflags = (int)env->cc_src;
        t0 &= DATA_MASK;
        src = t0;
        res = (t0 << count) | ((target_ulong)(eflags & CC_C) << (count - 1));
        if (count > 1) {
            res |= t0 >> (DATA_BITS + 1 - count);
        }
        t0 = res;
        env->cc_src = (eflags & ~(CC_C | CC_O)) |
            (lshift(src ^ t0, 11 - (DATA_BITS - 1)) & CC_O) |
            ((src >> (DATA_BITS - count)) & CC_C);
    }
    return t0;
}